

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_data.hpp
# Opt level: O2

LogicalType * __thiscall
duckdb::SerializationData::Get<duckdb::LogicalType_const&>(SerializationData *this)

{
  _Elt_pointer prVar1;
  
  AssertNotEmpty<std::reference_wrapper<duckdb::LogicalType_const>>(this,&this->types);
  prVar1 = (this->types).c.
           super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (prVar1 == (this->types).c.
                super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    prVar1 = (this->types).c.
             super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  return prVar1[-1]._M_data;
}

Assistant:

inline const LogicalType &SerializationData::Get() {
	AssertNotEmpty(types);
	return types.top();
}